

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

Result * __thiscall CoreML::Model::save(Result *__return_storage_ptr__,Model *this,ostream *out)

{
  element_type *this_00;
  bool bVar1;
  OstreamOutputStream *this_01;
  allocator<char> local_b1;
  Result r;
  string local_88;
  OstreamOutputStream rawOutput;
  
  if (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) == 0) {
    downgradeSpecificationVersion(this);
    validate(&r,this);
    bVar1 = Result::good(&r);
    if (bVar1) {
      this_00 = (this->m_spec).
                super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      google::protobuf::io::OstreamOutputStream::OstreamOutputStream(&rawOutput,out,-1);
      bVar1 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                        (&this_00->super_MessageLite,&rawOutput.super_ZeroCopyOutputStream);
      if (bVar1) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"unable to serialize object",&local_b1);
        Result::Result(__return_storage_ptr__,FAILED_TO_SERIALIZE,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      google::protobuf::io::OstreamOutputStream::~OstreamOutputStream(&rawOutput);
    }
    else {
      Result::Result(__return_storage_ptr__,&r);
    }
    this_01 = (OstreamOutputStream *)&r.m_message;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rawOutput,"unable to open file for write",(allocator<char> *)&r);
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,(string *)&rawOutput);
    this_01 = &rawOutput;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

Result Model::save(std::ostream& out) {
        if (!out.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for write");
        }

        // Before saving the model, always downgrade the specification version to
        // the minimal version supporting everything this model needs
        downgradeSpecificationVersion();

        // validate on save
        Result r = validate();
        if (!r.good()) {
            return r;
        }
        
        return saveSpecification(*m_spec, out);
    }